

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::dht_live_nodes_alert::~dht_live_nodes_alert(dht_live_nodes_alert *this)

{
  dht_live_nodes_alert *this_local;
  
  ~dht_live_nodes_alert(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_live_nodes_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT dht_live_nodes_alert(aux::stack_allocator& alloc
			, sha1_hash const& nid
			, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes);

		TORRENT_DEFINE_ALERT(dht_live_nodes_alert, 91)

		static inline constexpr alert_category_t static_category = alert_category::dht;
		std::string message() const override;

		// the local DHT node's node-ID this routing table belongs to
		sha1_hash node_id;

		// the number of nodes in the routing table and the actual nodes.
		int num_nodes() const;
		std::vector<std::pair<sha1_hash, udp::endpoint>> nodes() const;

	private:
		std::reference_wrapper<aux::stack_allocator> m_alloc;
		int m_v4_num_nodes = 0;
		int m_v6_num_nodes = 0;
		aux::allocation_slot m_v4_nodes_idx;
		aux::allocation_slot m_v6_nodes_idx;
	}